

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::convert_non_uniform_expression
          (CompilerGLSL *this,SPIRType *type,string *expr)

{
  ulong uVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string local_40;
  
  if ((*(this->backend).nonuniform_qualifier != '\0') &&
     (*(int *)&(type->super_IVariant).field_0xc - 0x10U < 3)) {
    uVar1 = ::std::__cxx11::string::find((char)expr,0x5b);
    uVar2 = ::std::__cxx11::string::rfind((char)expr,0x5d);
    if ((uVar1 <= uVar2) && ((uVar1 != 0xffffffffffffffff && (uVar2 != 0xffffffffffffffff)))) {
      ::std::__cxx11::string::substr((ulong)(local_90 + 0x10),(ulong)expr);
      ::std::__cxx11::string::substr((ulong)&stack0xffffffffffffff60,(ulong)expr);
      ::std::__cxx11::string::substr((ulong)local_60,(ulong)expr);
      join<std::__cxx11::string,char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                (&local_40,(spirv_cross *)(local_90 + 0x10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(this->backend).nonuniform_qualifier,(char **)0x2f8011,
                 (char (*) [2])&stack0xffffffffffffff60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e3e76,
                 (char (*) [2])local_60,in_stack_ffffffffffffff60);
      ::std::__cxx11::string::operator=((string *)expr,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      if (local_60[0] != local_50) {
        operator_delete(local_60[0]);
      }
      if (in_stack_ffffffffffffff60 !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90) {
        operator_delete(in_stack_ffffffffffffff60);
      }
      if ((undefined1 *)local_80._M_allocated_capacity != local_70) {
        operator_delete((void *)local_80._M_allocated_capacity);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::convert_non_uniform_expression(const SPIRType &type, std::string &expr)
{
	if (*backend.nonuniform_qualifier == '\0')
		return;

	// Handle SPV_EXT_descriptor_indexing.
	if (type.basetype == SPIRType::Sampler || type.basetype == SPIRType::SampledImage ||
	    type.basetype == SPIRType::Image)
	{
		// The image/sampler ID must be declared as non-uniform.
		// However, it is not legal GLSL to have
		// nonuniformEXT(samplers[index]), so we must move the nonuniform qualifier
		// to the array indexing, like
		// samplers[nonuniformEXT(index)].
		// While the access chain will generally be nonuniformEXT, it's not necessarily so,
		// so we might have to fixup the OpLoad-ed expression late.

		auto start_array_index = expr.find_first_of('[');
		auto end_array_index = expr.find_last_of(']');
		// Doesn't really make sense to declare a non-arrayed image with nonuniformEXT, but there's
		// nothing we can do here to express that.
		if (start_array_index == string::npos || end_array_index == string::npos || end_array_index < start_array_index)
			return;

		start_array_index++;

		expr = join(expr.substr(0, start_array_index), backend.nonuniform_qualifier, "(",
		            expr.substr(start_array_index, end_array_index - start_array_index), ")",
		            expr.substr(end_array_index, string::npos));
	}
}